

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::AST_Node_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_chaiscript::dispatch::detail::Const_Caller<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::AST_Node,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
::~Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_chaiscript::AST_Node_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_chaiscript::dispatch::detail::Const_Caller<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::AST_Node,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
           *this)

{
  pointer pTVar1;
  
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_00312c80;
  pTVar1 = (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base.m_types.
           super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)(this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base.
                                 m_types.
                                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~Proxy_Function_Callable_Impl() {}